

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
mxx::global_exscan<int>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          vector<int,_std::allocator<int>_> *in,comm *comm)

{
  size_type __n;
  const_iterator cVar1;
  const_iterator cVar2;
  iterator iVar3;
  allocator<int> local_22;
  undefined1 local_21;
  comm *local_20;
  comm *comm_local;
  vector<int,_std::allocator<int>_> *in_local;
  vector<int,_std::allocator<int>_> *result;
  
  local_21 = 0;
  local_20 = comm;
  comm_local = (comm *)in;
  in_local = __return_storage_ptr__;
  __n = std::vector<int,_std::allocator<int>_>::size(in);
  std::allocator<int>::allocator(&local_22);
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,__n,&local_22);
  std::allocator<int>::~allocator(&local_22);
  cVar1 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)comm_local);
  cVar2 = std::vector<int,_std::allocator<int>_>::end
                    ((vector<int,_std::allocator<int>_> *)comm_local);
  iVar3 = std::vector<int,_std::allocator<int>_>::begin(__return_storage_ptr__);
  global_exscan<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::plus<int>>
            (cVar1._M_current,cVar2._M_current,iVar3._M_current,local_20);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> global_exscan(const std::vector<T>& in, const mxx::comm& comm = mxx::comm()) {
    std::vector<T> result(in.size());
    global_exscan(in.begin(), in.end(), result.begin(), std::plus<T>(), comm);
    return result;
}